

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

bool __thiscall
cmMakefile::ReadListFileAsString(cmMakefile *this,string *content,string *virtualFileName)

{
  bool bVar1;
  string *in_base;
  char *str;
  char *virtual_filename;
  cmMessenger *messenger;
  element_type *this_00;
  undefined1 local_a8 [16];
  undefined1 local_98 [32];
  cmListFile listFile;
  ListFileScope scope;
  string filenametoread;
  string *virtualFileName_local;
  string *content_local;
  cmMakefile *this_local;
  
  in_base = GetCurrentSourceDirectory_abi_cxx11_(this);
  cmsys::SystemTools::CollapseFullPath((string *)&scope.ReportError,virtualFileName,in_base);
  ListFileScope::ListFileScope
            ((ListFileScope *)&stack0xffffffffffffffa8,this,(string *)&scope.ReportError);
  cmListFile::cmListFile((cmListFile *)(local_98 + 0x18));
  str = (char *)std::__cxx11::string::c_str();
  virtual_filename = (char *)std::__cxx11::string::c_str();
  messenger = GetMessenger(this);
  bVar1 = cmListFile::ParseString
                    ((cmListFile *)(local_98 + 0x18),str,virtual_filename,messenger,&this->Backtrace
                    );
  if (bVar1) {
    GetCMakeInstance(this);
    cmake::GetDebugAdapter((cmake *)local_98);
    bVar1 = std::operator!=((shared_ptr<cmDebugger::cmDebuggerAdapter> *)local_98,(nullptr_t)0x0);
    std::shared_ptr<cmDebugger::cmDebuggerAdapter>::~shared_ptr
              ((shared_ptr<cmDebugger::cmDebuggerAdapter> *)local_98);
    if (bVar1) {
      GetCMakeInstance(this);
      cmake::GetDebugAdapter((cmake *)local_a8);
      this_00 = std::
                __shared_ptr_access<cmDebugger::cmDebuggerAdapter,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<cmDebugger::cmDebuggerAdapter,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)local_a8);
      cmDebugger::cmDebuggerAdapter::OnFileParsedSuccessfully
                (this_00,(string *)&scope.ReportError,
                 (vector<cmListFileFunction,_std::allocator<cmListFileFunction>_> *)
                 (local_98 + 0x18));
      std::shared_ptr<cmDebugger::cmDebuggerAdapter>::~shared_ptr
                ((shared_ptr<cmDebugger::cmDebuggerAdapter> *)local_a8);
    }
    RunListFile(this,(cmListFile *)(local_98 + 0x18),(string *)&scope.ReportError,
                (DeferCommands *)0x0);
    bVar1 = cmSystemTools::GetFatalErrorOccurred();
    if (bVar1) {
      ListFileScope::Quiet((ListFileScope *)&stack0xffffffffffffffa8);
    }
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  local_98._20_4_ = 1;
  cmListFile::~cmListFile((cmListFile *)(local_98 + 0x18));
  ListFileScope::~ListFileScope((ListFileScope *)&stack0xffffffffffffffa8);
  std::__cxx11::string::~string((string *)&scope.ReportError);
  return this_local._7_1_;
}

Assistant:

bool cmMakefile::ReadListFileAsString(const std::string& content,
                                      const std::string& virtualFileName)
{
  std::string filenametoread = cmSystemTools::CollapseFullPath(
    virtualFileName, this->GetCurrentSourceDirectory());

  ListFileScope scope(this, filenametoread);

  cmListFile listFile;
  if (!listFile.ParseString(content.c_str(), virtualFileName.c_str(),
                            this->GetMessenger(), this->Backtrace)) {
    return false;
  }

#ifdef CMake_ENABLE_DEBUGGER
  if (this->GetCMakeInstance()->GetDebugAdapter() != nullptr) {
    this->GetCMakeInstance()->GetDebugAdapter()->OnFileParsedSuccessfully(
      filenametoread, listFile.Functions);
  }
#endif

  this->RunListFile(listFile, filenametoread);
  if (cmSystemTools::GetFatalErrorOccurred()) {
    scope.Quiet();
  }
  return true;
}